

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-close-fd.c
# Opt level: O3

int run_test_close_fd(void)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 *extraout_RDX;
  int64_t eval_b_1;
  int64_t eval_b_3;
  uv_os_fd_t fd [2];
  uv_pipe_t pipe_handle;
  uv_fs_t req;
  undefined4 local_2d0;
  int local_2cc;
  undefined1 local_2c8 [16];
  undefined8 local_2b0 [29];
  long local_1c8 [11];
  long local_170;
  
  local_2c8 = uv_buf_init("",1);
  iVar1 = uv_pipe(&local_2d0,0,0);
  local_1c8[0] = (long)iVar1;
  local_2b0[0] = 0;
  if (local_1c8[0] == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_pipe_init(uVar2,local_2b0,0);
    local_1c8[0] = (long)iVar1;
    if (local_1c8[0] != 0) goto LAB_00183306;
    iVar1 = uv_pipe_open(local_2b0,local_2d0);
    local_1c8[0] = (long)iVar1;
    if (local_1c8[0] != 0) goto LAB_00183318;
    local_2d0 = 0xffffffff;
    iVar1 = uv_fs_write(0,local_1c8,local_2cc,local_2c8,1,0xffffffffffffffff,0);
    if (iVar1 != 1) goto LAB_0018332a;
    if (local_170 != 1) goto LAB_00183339;
    uv_fs_req_cleanup(local_1c8);
    iVar1 = close(local_2cc);
    if (iVar1 != 0) goto LAB_00183348;
    local_2cc = -1;
    iVar1 = uv_read_start(local_2b0,alloc_cb,read_cb);
    if (iVar1 != 0) goto LAB_00183357;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_00183366;
    if (read_cb_called != 1) goto LAB_00183375;
    iVar1 = uv_is_active(local_2b0);
    if (iVar1 != 0) goto LAB_00183384;
    iVar1 = uv_read_start(local_2b0,alloc_cb,read_cb);
    if (iVar1 != 0) goto LAB_00183393;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_001833a2;
    if (read_cb_called != 2) goto LAB_001833b1;
    iVar1 = uv_is_closing(local_2b0);
    if (iVar1 != 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001833cf;
    }
  }
  else {
    run_test_close_fd_cold_1();
LAB_00183306:
    run_test_close_fd_cold_2();
LAB_00183318:
    run_test_close_fd_cold_3();
LAB_0018332a:
    run_test_close_fd_cold_4();
LAB_00183339:
    run_test_close_fd_cold_5();
LAB_00183348:
    run_test_close_fd_cold_6();
LAB_00183357:
    run_test_close_fd_cold_7();
LAB_00183366:
    run_test_close_fd_cold_8();
LAB_00183375:
    run_test_close_fd_cold_9();
LAB_00183384:
    run_test_close_fd_cold_10();
LAB_00183393:
    run_test_close_fd_cold_11();
LAB_001833a2:
    run_test_close_fd_cold_12();
LAB_001833b1:
    run_test_close_fd_cold_13();
  }
  run_test_close_fd_cold_15();
LAB_001833cf:
  run_test_close_fd_cold_14();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 1;
  return 0x365054;
}

Assistant:

TEST_IMPL(close_fd) {
  uv_pipe_t pipe_handle;
  uv_fs_t req;
  uv_buf_t bufs[1];
  uv_os_fd_t fd[2];
  bufs[0] = uv_buf_init("", 1);

  ASSERT_OK(uv_pipe(fd, 0, 0));
  ASSERT_OK(uv_pipe_init(uv_default_loop(), &pipe_handle, 0));
  ASSERT_OK(uv_pipe_open(&pipe_handle, fd[0]));
  /* uv_pipe_open() takes ownership of the file descriptor. */
#ifdef _WIN32
  fd[0] = INVALID_HANDLE_VALUE;
#else
  fd[0] = -1;
#endif

  ASSERT_EQ(1, uv_fs_write(NULL, &req, fd[1], bufs, 1, -1, NULL));
  ASSERT_EQ(1, req.result);
  uv_fs_req_cleanup(&req);
#ifdef _WIN32
  ASSERT_NE(0, CloseHandle(fd[1]));
  fd[1] = INVALID_HANDLE_VALUE;
#else
  ASSERT_OK(close(fd[1]));
  fd[1] = -1;
#endif
  ASSERT_OK(uv_read_start((uv_stream_t *) &pipe_handle, alloc_cb, read_cb));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_EQ(1, read_cb_called);
  ASSERT_OK(uv_is_active((const uv_handle_t *) &pipe_handle));
  ASSERT_OK(uv_read_start((uv_stream_t *) &pipe_handle, alloc_cb, read_cb));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  ASSERT_EQ(2, read_cb_called);
  ASSERT_NE(0, uv_is_closing((const uv_handle_t *) &pipe_handle));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}